

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

int NULLC::StrEqual(NULLCArray a,NULLCArray b)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = a.len;
  uVar2 = 0;
  if (uVar4 == b.len) {
    if (uVar4 == 0) {
      return 1;
    }
    if (*a.ptr == *b.ptr) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (uVar4 == uVar3) break;
        uVar1 = uVar3 + 1;
      } while (a.ptr[uVar3] == b.ptr[uVar3]);
      uVar2 = (uint)(uVar4 <= uVar3);
    }
  }
  return uVar2;
}

Assistant:

int NULLC::StrEqual(NULLCArray a, NULLCArray b)
{
	if(a.len != b.len)
		return 0;
	for(unsigned int i = 0; i < a.len; i++)
		if(a.ptr[i] != b.ptr[i])
			return 0;
	return 1;
}